

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

bool P_Move(AActor *actor)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  ASectorAction *pAVar4;
  sector_t *sec;
  line_t_conflict *line;
  double dVar5;
  double dVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  AActor *this;
  byte bVar12;
  bool bVar13;
  DVector2 move;
  double friction;
  DVector2 ptry;
  TAngle<double> local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  DVector3 local_110;
  double local_f8;
  double local_f0;
  double local_e8;
  undefined8 uStack_e0;
  TVector2<double> local_d8;
  FCheckPosition local_c8;
  
  local_158 = actor->Speed;
  local_118 = 0.90625;
  uVar8 = (actor->flags2).Value;
  bVar12 = 1;
  if ((uVar8 & 8) != 0) goto LAB_003eddc9;
  if ((actor->movedir == 8) ||
     ((((uStack_150 = 0, ((actor->flags).Value & 0x200) == 0 &&
        (((actor->flags6).Value & 0x400) == 0)) && ((uVar8 >> 0xb & 1) == 0)) &&
      (dVar2 = (actor->__Pos).Z, actor->floorz <= dVar2 && dVar2 != actor->floorz)))) {
    bVar12 = 0;
    goto LAB_003eddc9;
  }
  if (7 < actor->movedir) {
    I_Error("Weird actor->movedir!");
  }
  this = (actor->target).field_0.p;
  if ((this != (AActor *)0x0) && (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (actor->target).field_0.p = (AActor *)0x0;
    this = (AActor *)0x0;
  }
  iVar9 = 0;
  if (((this != (AActor *)0x0) && (iVar9 = 0, ((actor->flags6).Value & 0x800) != 0)) &&
     (bVar7 = AActor::IsFriend(this,actor), !bVar7)) {
    iVar9 = 0;
    dVar2 = AActor::Distance2D(actor,this,false);
    if (dVar2 < 144.0) {
      uVar8 = FRandom::GenRand32(&pr_dropoff);
      iVar9 = (uint)((uVar8 & 0xff) < 0xeb) * 2;
    }
  }
  if ((compatflags.Value._3_1_ & 1) == 0) {
    local_140 = 0.03125;
  }
  else {
    local_140 = P_GetMoveFactor(actor,&local_118);
    if (local_118 < 0.90625) {
      local_158 = local_158 * ((0.03125 - local_140) * -0.5 + 0.03125) * 32.0;
      if ((local_158 == 0.0) && (!NAN(local_158))) {
        local_158 = actor->Speed;
        uStack_150 = 0;
      }
    }
  }
  local_e8 = xspeed[actor->movedir] * local_158;
  local_158 = local_158 * yspeed[actor->movedir];
  dVar2 = actor->radius + -1.0;
  iVar11 = 1;
  uStack_e0 = 0;
  if (0.0 < dVar2) {
    dVar5 = ABS(local_158);
    if (dVar5 < ABS(local_e8)) {
      dVar5 = ABS(local_e8);
    }
    if (dVar2 < dVar5) {
      iVar11 = (int)(dVar5 / dVar2) + 1;
    }
  }
  dVar2 = (actor->__Pos).X;
  dVar5 = (actor->__Pos).Y;
  local_c8.LastRipped.NumUsed = 0;
  iVar10 = 1;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_c8.LastRipped,1);
  local_c8.DoRipping = false;
  local_c8.PushTime = 0;
  local_c8.FromPMove = true;
  local_168.Degrees = local_e8;
  dStack_160 = local_158;
  if (iVar11 < 1) {
    bVar7 = true;
  }
  else {
    local_138 = (actor->Angles).Yaw.Degrees;
    local_120 = 1.0 / (double)iVar11;
    local_130 = dVar2;
    local_128 = dVar5;
    do {
      local_f8 = (double)iVar10;
      local_110.X = local_168.Degrees * local_f8 * local_120 + local_130;
      local_110.Y = dStack_160 * local_f8 * local_120 + local_128;
      bVar7 = P_TryMove(actor,(DVector2 *)&local_110,iVar9,(secplane_t *)0x0,&local_c8,false);
      if (!bVar7) break;
      if (iVar11 != 1) {
        dVar3 = (actor->__Pos).X;
        if ((dVar3 == local_110.X) && (!NAN(dVar3) && !NAN(local_110.X))) {
          dVar3 = (actor->__Pos).Y;
          if ((dVar3 == local_110.Y) && (!NAN(dVar3) && !NAN(local_110.Y))) goto LAB_003ed9f4;
        }
        dVar3 = (double)SUB84(((actor->Angles).Yaw.Degrees - local_138) * 11930464.711111112 +
                              6755399441055744.0,0) * 8.381903171539307e-08;
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          local_f0 = dVar3;
          TVector2<double>::Rotated<double>(&local_d8,&local_168);
          local_168.Degrees = local_d8.X;
          dStack_160 = local_d8.Y;
          local_138 = (actor->Angles).Yaw.Degrees;
        }
        local_130 = (actor->__Pos).X - local_168.Degrees * local_f8 * local_120;
        local_128 = (actor->__Pos).Y - local_f8 * dStack_160 * local_120;
      }
LAB_003ed9f4:
      bVar13 = iVar11 != iVar10;
      iVar10 = iVar10 + 1;
    } while (bVar7 && bVar13);
  }
  if (nomonsterinterpolation.Value == true) {
    dVar3 = (actor->__Pos).X;
    dVar6 = (actor->__Pos).Y;
    (actor->Prev).Z = (actor->__Pos).Z;
    (actor->Prev).X = dVar3;
    (actor->Prev).Y = dVar6;
    (actor->PrevAngles).Roll.Degrees = (actor->Angles).Roll.Degrees;
    dVar3 = (actor->Angles).Yaw.Degrees;
    (actor->PrevAngles).Pitch.Degrees = (actor->Angles).Pitch.Degrees;
    (actor->PrevAngles).Yaw.Degrees = dVar3;
    if (actor->Sector == (sector_t *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = actor->Sector->PortalGroup;
    }
    actor->PrevPortalGroup = iVar9;
  }
  if ((0.90625 < local_118 & bVar7) == 1) {
    AActor::SetOrigin(actor,dVar2,dVar5,(actor->__Pos).Z,false);
    (actor->Vel).X = local_e8 * local_140 * 8.0 + (actor->Vel).X;
    (actor->Vel).Y = local_140 * 8.0 * local_158 + (actor->Vel).Y;
  }
  if (bVar7 == false) {
LAB_003edc48:
    if (((((actor->flags6).Value & 0x400) != 0) || (((actor->flags).Value & 0x4000) != 0)) &&
       (local_c8.floatok == true)) {
      dVar2 = (actor->__Pos).Z;
      (actor->__Pos).Z =
           (double)(~-(ulong)(dVar2 < local_c8.floorz) & (ulong)-actor->FloatSpeed |
                   (ulong)actor->FloatSpeed & -(ulong)(dVar2 < local_c8.floorz)) + dVar2;
      bVar7 = P_TestMobjZ(actor,true,(AActor **)0x0);
      if (bVar7) {
        pbVar1 = (byte *)((long)&(actor->flags).Value + 2);
        *pbVar1 = *pbVar1 | 0x20;
      }
      else {
        (actor->__Pos).Z = dVar2;
      }
      bVar12 = 1;
      if (bVar7) goto LAB_003edda4;
    }
    if (spechit.Count != 0) {
      actor->movedir = '\b';
      if (((actor->flags6).Value & 0x10000) == 0) {
        bVar12 = 0;
        while (spechit.Count != 0) {
          spechit.Count = spechit.Count - 1;
          line = (line_t_conflict *)spechit.Array[spechit.Count].line;
          if (((((actor->flags4).Value & 0x200) != 0) &&
              (bVar7 = P_ActivateLine(line,actor,0,2,(DVector3 *)0x0), bVar7)) ||
             ((((actor->flags2).Value & 0x400000) != 0 &&
              (bVar7 = P_ActivateLine(line,actor,0,0x10,(DVector3 *)0x0), bVar7)))) {
            bVar12 = bVar12 | (line != (line_t_conflict *)actor->BlockingLine) + 1U;
          }
        }
      }
      else {
        spechit.Count = 0;
        bVar12 = 0;
      }
      if (bVar12 != 0) {
        uVar8 = FRandom::GenRand32(&pr_opendoor);
        bVar12 = bVar12 ^ 0xca < (uVar8 & 0xff);
        goto LAB_003edda4;
      }
    }
    bVar12 = 0;
  }
  else {
    if ((((actor->flags).Value & 0x200) == 0) && (((actor->flags6).Value & 0x400) == 0)) {
      dVar2 = (actor->__Pos).Z;
      dVar5 = actor->floorz;
      if ((dVar5 < dVar2) &&
         ((((actor->flags2).Value & 0x800) == 0 && (dVar2 <= actor->MaxStepHeight + dVar5)))) {
        (actor->__Pos).Z = dVar5;
        bVar13 = P_TestMobjZ(actor,true,(AActor **)0x0);
        if (bVar13) {
          pAVar4 = (actor->floorsector->SecActTarget).field_0.p;
          if (pAVar4 != (ASectorAction *)0x0) {
            if (((pAVar4->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
              dVar2 = actor->floorz;
              sec = actor->floorsector;
              AActor::PosRelative(&local_110,actor,sec);
              dVar5 = (local_110.Y * (sec->floorplane).normal.Y +
                      local_110.X * (sec->floorplane).normal.X + (sec->floorplane).D) *
                      (sec->floorplane).negiC;
              if ((dVar2 == dVar5) && (!NAN(dVar2) && !NAN(dVar5))) {
                ASectorAction::TriggerAction((actor->floorsector->SecActTarget).field_0.p,actor,4);
              }
            }
            else {
              (actor->floorsector->SecActTarget).field_0.p = (ASectorAction *)0x0;
            }
          }
          P_CheckFor3DFloorHit(actor,(actor->__Pos).Z);
        }
        else {
          (actor->__Pos).Z = dVar2;
        }
      }
    }
    if (bVar7 == false) goto LAB_003edc48;
    pbVar1 = (byte *)((long)&(actor->flags).Value + 2);
    *pbVar1 = *pbVar1 & 0xdf;
    bVar12 = 1;
  }
LAB_003edda4:
  M_Free(local_c8.LastRipped.Nodes);
LAB_003eddc9:
  return (bool)(bVar12 & 1);
}

Assistant:

bool P_Move (AActor *actor)
{

	double tryx, tryy, deltax, deltay, origx, origy;
	bool try_ok;
	double speed = actor->Speed;
	double movefactor = ORIG_FRICTION_FACTOR;
	double friction = ORIG_FRICTION;
	int dropoff = 0;

	if (actor->flags2 & MF2_BLASTED)
	{
		return true;
	}

	if (actor->movedir == DI_NODIR)
	{
		return false;
	}

	// [RH] Walking actors that are not on the ground cannot walk. We don't
	// want to yank them to the ground here as Doom did, since that makes
	// it difficult to thrust them vertically in a reasonable manner.
	// [GZ] Let jumping actors jump.
	if (!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
		&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		return false;
	}

	if ((unsigned)actor->movedir >= 8)
		I_Error ("Weird actor->movedir!");

	// killough 10/98: allow dogs to drop off of taller ledges sometimes.
	// dropoff==1 means always allow it, dropoff==2 means only up to 128 high,
	// and only if the target is immediately on the other side of the line.
	AActor *target = actor->target;

	if ((actor->flags6 & MF6_JUMPDOWN) && target &&
			!(target->IsFriend(actor)) &&
			actor->Distance2D(target) < 144 &&
			pr_dropoff() < 235)
	{
		dropoff = 2;
	}

	// [RH] I'm not so sure this is such a good idea
	// [GZ] That's why it's compat-optioned.
	if (compatflags & COMPATF_MBFMONSTERMOVE)
	{
		// killough 10/98: make monsters get affected by ice and sludge too:
		movefactor = P_GetMoveFactor (actor, &friction);

		if (friction < ORIG_FRICTION)
		{ // sludge
			speed = speed * ((ORIG_FRICTION_FACTOR - (ORIG_FRICTION_FACTOR-movefactor)/2)) / ORIG_FRICTION_FACTOR;
			if (speed == 0)
			{ // always give the monster a little bit of speed
				speed = actor->Speed;
			}
		}
	}

	tryx = (origx = actor->X()) + (deltax = (speed * xspeed[actor->movedir]));
	tryy = (origy = actor->Y()) + (deltay = (speed * yspeed[actor->movedir]));

	// Like P_XYMovement this should do multiple moves if the step size is too large

	double maxmove = actor->radius - 1;
	int steps = 1;

	if (maxmove > 0)
	{ 
		const double xspeed = fabs (deltax);
		const double yspeed = fabs (deltay);

		if (xspeed > yspeed)
		{
			if (xspeed > maxmove)
			{
				steps = 1 + int(xspeed / maxmove);
			}
		}
		else
		{
			if (yspeed > maxmove)
			{
				steps = 1 + int(yspeed / maxmove);
			}
		}
	}
	FCheckPosition tm;

	tm.FromPMove = true;

	DVector2 start = { origx, origy };
	DVector2 move = { deltax, deltay };
	DAngle oldangle = actor->Angles.Yaw;

	try_ok = true;
	for (int i = 1; i <= steps; i++)
	{
		DVector2 ptry = start + move * i / steps;
		// killough 3/15/98: don't jump over dropoffs:
		try_ok = P_TryMove(actor, ptry, dropoff, NULL, tm);
		if (!try_ok) break;

		// Handle portal transitions just like P_XYMovement.
		if (steps > 1 && actor->Pos().XY() != ptry)
		{
			DAngle anglediff = deltaangle(oldangle, actor->Angles.Yaw);

			if (anglediff != 0)
			{
				move = move.Rotated(anglediff);
				oldangle = actor->Angles.Yaw;
			}
			start = actor->Pos() - move * i / steps;
		}
	}

	// [GrafZahl] Interpolating monster movement as it is done here just looks bad
	// so make it switchable
	if (nomonsterinterpolation)
	{
		actor->ClearInterpolation();
	}

	if (try_ok && friction > ORIG_FRICTION)
	{
		actor->SetOrigin(origx, origy, actor->Z(), false);
		movefactor *= 1.f / ORIG_FRICTION_FACTOR / 4;
		actor->Vel.X += deltax * movefactor;
		actor->Vel.Y += deltay * movefactor;
	}

	// [RH] If a walking monster is no longer on the floor, move it down
	// to the floor if it is within MaxStepHeight, presuming that it is
	// actually walking down a step.
	if (try_ok &&
		!((actor->flags & MF_NOGRAVITY) || (actor->flags6 & MF6_CANJUMP))
			&& actor->Z() > actor->floorz && !(actor->flags2 & MF2_ONMOBJ))
	{
		if (actor->Z() <= actor->floorz + actor->MaxStepHeight)
		{
			double savedz = actor->Z();
			actor->SetZ(actor->floorz);
			// Make sure that there isn't some other actor between us and
			// the floor we could get stuck in. The old code did not do this.
			if (!P_TestMobjZ(actor))
			{
				actor->SetZ(savedz);
			}
			else
			{ // The monster just hit the floor, so trigger any actions.
				if (actor->floorsector->SecActTarget != NULL &&
					actor->floorz == actor->floorsector->floorplane.ZatPoint(actor->PosRelative(actor->floorsector)))
				{
					actor->floorsector->SecActTarget->TriggerAction(actor, SECSPAC_HitFloor);
				}
				P_CheckFor3DFloorHit(actor, actor->Z());
			}
		}
	}

	if (!try_ok)
	{
		if (((actor->flags6 & MF6_CANJUMP)||(actor->flags & MF_FLOAT)) && tm.floatok)
		{ // must adjust height
			double savedz = actor->Z();

			if (actor->Z() < tm.floorz)
				actor->AddZ(actor->FloatSpeed);
			else
				actor->AddZ(-actor->FloatSpeed);


			// [RH] Check to make sure there's nothing in the way of the float
			if (P_TestMobjZ (actor))
			{
				actor->flags |= MF_INFLOAT;
				return true;
			}
			actor->SetZ(savedz);
		}

		if (!spechit.Size ())
		{
			return false;
		}

		// open any specials
		actor->movedir = DI_NODIR;

		// if the special is not a door that can be opened, return false
		//
		// killough 8/9/98: this is what caused monsters to get stuck in
		// doortracks, because it thought that the monster freed itself
		// by opening a door, even if it was moving towards the doortrack,
		// and not the door itself.
		//
		// killough 9/9/98: If a line blocking the monster is activated,
		// return true 90% of the time. If a line blocking the monster is
		// not activated, but some other line is, return false 90% of the
		// time. A bit of randomness is needed to ensure it's free from
		// lockups, but for most cases, it returns the correct result.
		//
		// Do NOT simply return false 1/4th of the time (causes monsters to
		// back out when they shouldn't, and creates secondary stickiness).

		spechit_t spec;
		int good = 0;
		
		if (!(actor->flags6 & MF6_NOTRIGGER))
		{
			while (spechit.Pop (spec))
			{
				// [RH] let monsters push lines, as well as use them
				if (((actor->flags4 & MF4_CANUSEWALLS) && P_ActivateLine (spec.line, actor, 0, SPAC_Use)) ||
					((actor->flags2 & MF2_PUSHWALL) && P_ActivateLine (spec.line, actor, 0, SPAC_Push)))
				{
					good |= spec.line == actor->BlockingLine ? 1 : 2;
				}
			}
		}
		else spechit.Clear();
		return good && ((pr_opendoor() >= 203) ^ (good & 1));
	}
	else
	{
		actor->flags &= ~MF_INFLOAT;
	}
	return true; 
}